

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.cc
# Opt level: O3

void __thiscall fasttext::QMatrix::load(QMatrix *this,istream *in)

{
  pointer puVar1;
  pointer pPVar2;
  allocator_type local_39;
  undefined1 local_38 [16];
  pointer local_28;
  
  std::istream::read((char *)in,(long)&this->qnorm_);
  std::istream::read((char *)in,(long)&this->m_);
  std::istream::read((char *)in,(long)&this->n_);
  std::istream::read((char *)in,(long)&this->codesize_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,(long)this->codesize_
             ,&local_39);
  puVar1 = (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_38._0_8_;
  (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_38._8_8_;
  local_38 = ZEXT816(0) << 0x20;
  (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_28;
  local_28 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
    if ((pointer)local_38._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_38._0_8_);
    }
  }
  std::istream::read((char *)in,
                     (long)(this->codes_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  pPVar2 = (pointer)operator_new(0x50);
  pPVar2->nbits_ = 8;
  pPVar2->ksub_ = 0x100;
  pPVar2->max_points_per_cluster_ = 0x100;
  pPVar2->max_points_ = 0x10000;
  pPVar2->seed_ = 0x4d2;
  pPVar2->niter_ = 0x19;
  pPVar2->eps_ = 1e-07;
  (pPVar2->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar2->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (pPVar2->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  (pPVar2->rng)._M_x = 1;
  std::__uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  ::reset((__uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
           *)this,pPVar2);
  ProductQuantizer::load
            ((this->pq_)._M_t.
             super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
             ._M_t.
             super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
             .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,in);
  if (this->qnorm_ == true) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,this->m_,&local_39)
    ;
    puVar1 = (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_38._0_8_;
    (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_38._8_8_;
    local_38 = ZEXT816(0) << 0x20;
    (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_28;
    local_28 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
      if ((pointer)local_38._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_38._0_8_);
      }
    }
    std::istream::read((char *)in,
                       (long)(this->norm_codes_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    pPVar2 = (pointer)operator_new(0x50);
    pPVar2->nbits_ = 8;
    pPVar2->ksub_ = 0x100;
    pPVar2->max_points_per_cluster_ = 0x100;
    pPVar2->max_points_ = 0x10000;
    pPVar2->seed_ = 0x4d2;
    pPVar2->niter_ = 0x19;
    pPVar2->eps_ = 1e-07;
    (pPVar2->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pPVar2->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
    (pPVar2->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
    (pPVar2->rng)._M_x = 1;
    std::
    __uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    reset((__uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
           *)&this->npq_,pPVar2);
    ProductQuantizer::load
              ((this->npq_)._M_t.
               super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
               ._M_t.
               super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
               .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,in);
  }
  return;
}

Assistant:

void QMatrix::load(std::istream& in) {
  in.read((char*)&qnorm_, sizeof(qnorm_));
  in.read((char*)&m_, sizeof(m_));
  in.read((char*)&n_, sizeof(n_));
  in.read((char*)&codesize_, sizeof(codesize_));
  codes_ = std::vector<uint8_t>(codesize_);
  in.read((char*)codes_.data(), codesize_ * sizeof(uint8_t));
  pq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer());
  pq_->load(in);
  if (qnorm_) {
    norm_codes_ = std::vector<uint8_t>(m_);
    in.read((char*)norm_codes_.data(), m_ * sizeof(uint8_t));
    npq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer());
    npq_->load(in);
  }
}